

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O0

int cueify_device_open(cueify_device *d,char *device)

{
  size_t sVar1;
  void *pvVar2;
  int retval;
  cueify_device_private *dev;
  char *device_local;
  cueify_device *d_local;
  
  if (d == (cueify_device *)0x0) {
    d_local._4_4_ = 3;
  }
  else {
    dev = (cueify_device_private *)device;
    if ((device == (char *)0x0) &&
       (dev = (cueify_device_private *)cueify_device_get_default_device(),
       dev == (cueify_device_private *)0x0)) {
      d_local._4_4_ = 5;
    }
    else if ((char)dev->handle == '\0') {
      d_local._4_4_ = 3;
    }
    else {
      memset(d,0,0x10);
      sVar1 = strlen((char *)dev);
      pvVar2 = malloc(sVar1 + 1);
      d[1] = pvVar2;
      if (d[1] == (cueify_device)0x0) {
        d_local._4_4_ = 4;
      }
      else {
        strcpy((char *)d[1],(char *)dev);
        d_local._4_4_ = cueify_device_open_unportable((cueify_device_private *)d,(char *)dev);
        if (d_local._4_4_ != 0) {
          free(d[1]);
        }
      }
    }
  }
  return d_local._4_4_;
}

Assistant:

int cueify_device_open(cueify_device *d, const char *device) {
    cueify_device_private *dev = (cueify_device_private *)d;
    int retval = CUEIFY_OK;

    /* Must have a defined device instance */
    if (dev == NULL) {
	return CUEIFY_ERR_BADARG;
    }
    /* Get the default device if needed */
    if (device == NULL) {
	device = cueify_device_get_default_device();
	if (device == NULL) {
	    return CUEIFY_ERR_NO_DEVICE;
	}
    }
    /* The device should actually be something */
    if (device[0] == '\0') {
	return CUEIFY_ERR_BADARG;
    }

    memset(dev, 0, sizeof(cueify_device_private));
    dev->path = malloc(strlen(device) + 1);
    if (dev->path == NULL) {
	return CUEIFY_ERR_NOMEM;
    }
    strcpy(dev->path, device);

    retval = cueify_device_open_unportable(dev, device);
    if (retval != CUEIFY_OK) {
	free(dev->path);
    }
    return retval;
}